

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O0

void anon_unknown.dwarf_41187::writePlaceholderMap
               (map<unsigned_long,_wasm::Name,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                *placeholderMap,string *filename)

{
  bool bVar1;
  ostream *this;
  reference __in;
  type *ptVar2;
  type *ptVar3;
  ostream *poVar4;
  ostream *poVar5;
  Name name;
  type *func;
  type *index;
  _Self local_358;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_long,_wasm::Name,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
  *__range1;
  ostream *o;
  Output output;
  string *filename_local;
  map<unsigned_long,_wasm::Name,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
  *placeholderMap_local;
  
  ::wasm::Output::Output((Output *)&o,(string *)filename,Text);
  this = ::wasm::Output::getStream((Output *)&o);
  poVar5 = this;
  __end1 = std::
           map<unsigned_long,_wasm::Name,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
           ::begin(placeholderMap);
  local_358._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_wasm::Name,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
       ::end(placeholderMap);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&local_358);
    if (!bVar1) break;
    __in = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_wasm::Name>_>::operator*
                     (&__end1);
    ptVar2 = std::get<0ul,unsigned_long_const,wasm::Name>(__in);
    ptVar3 = std::get<1ul,unsigned_long_const,wasm::Name>(__in);
    poVar4 = (ostream *)std::ostream::operator<<(this,*ptVar2);
    poVar4 = std::operator<<(poVar4,':');
    name.super_IString.str._M_str = (char *)poVar5;
    name.super_IString.str._M_len = (size_t)(ptVar3->super_IString).str._M_str;
    poVar4 = ::wasm::operator<<((wasm *)poVar4,(ostream *)(ptVar3->super_IString).str._M_len,name);
    std::operator<<(poVar4,'\n');
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_wasm::Name>_>::operator++(&__end1);
  }
  ::wasm::Output::~Output((Output *)&o);
  return;
}

Assistant:

void writePlaceholderMap(const std::map<size_t, Name> placeholderMap,
                         std::string filename) {
  Output output(filename, Flags::Text);
  auto& o = output.getStream();
  for (auto& [index, func] : placeholderMap) {
    o << index << ':' << func << '\n';
  }
}